

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboTestUtil.cpp
# Opt level: O3

RGBA deqp::gles3::Functional::FboTestUtil::getToSRGBConversionThreshold
               (TextureFormat *src,TextureFormat *dst)

{
  uint uVar1;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  float fVar7;
  IVec4 bits;
  int local_28;
  int local_24;
  int local_20;
  uint local_1c;
  int iVar2;
  
  tcu::getTextureFormatMantissaBitDepth((tcu *)&local_28,src);
  uVar5 = 1;
  if ((long)local_28 < 0xd) {
    uVar5 = *(uint *)(getToSRGB8ConversionError(int)::errors + (long)local_28 * 4);
  }
  uVar4 = 0x100;
  if ((long)local_24 < 0xd) {
    uVar4 = *(int *)(getToSRGB8ConversionError(int)::errors + (long)local_24 * 4) << 8;
  }
  uVar6 = 0x10000;
  if ((long)local_20 < 0xd) {
    uVar6 = *(int *)(getToSRGB8ConversionError(int)::errors + (long)local_20 * 4) << 0x10;
  }
  uVar1 = 0;
  if (dst->order == sRGBA) {
    if ((int)local_1c < 1) {
      uVar1 = 0x1000000;
    }
    else {
      uVar1 = 8;
      if (local_1c < 8) {
        uVar1 = local_1c;
      }
      fVar7 = ceilf(510.0 / (float)~(-1 << ((byte)uVar1 & 0x1f)));
      iVar3 = 0xff;
      if ((int)fVar7 < 0xff) {
        iVar3 = (int)fVar7;
      }
      iVar2 = 0;
      if (0 < iVar3) {
        iVar2 = iVar3;
      }
      uVar1 = iVar2 << 0x18;
    }
  }
  return (RGBA)(uVar4 | uVar5 | uVar6 | uVar1);
}

Assistant:

tcu::RGBA getToSRGBConversionThreshold (const tcu::TextureFormat& src, const tcu::TextureFormat& dst)
{
	// Only SRGB8 and SRGB8_ALPHA8 formats are supported.
	DE_ASSERT(dst.type == tcu::TextureFormat::UNORM_INT8 && tcu::isSRGB(dst));

	const tcu::IVec4	bits		= tcu::getTextureFormatMantissaBitDepth(src);
	const bool			dstHasAlpha	= dst.order == tcu::TextureFormat::sRGBA;

	return tcu::RGBA(getToSRGB8ConversionError(bits.x()),
					 getToSRGB8ConversionError(bits.y()),
					 getToSRGB8ConversionError(bits.z()),
					 dstHasAlpha ? calculateU8ConversionError(bits.w()) : 0);
}